

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPrism>_>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPrism>_> *this,
          TPZGeoBlend<pzgeom::TPZGeoPrism> *geo,int matind,TPZGeoMesh *mesh)

{
  undefined4 in_EDX;
  TPZGeoBlend<pzgeom::TPZGeoPrism> *in_RSI;
  TPZRegisterClassId *in_RDI;
  int i;
  TPZGeoEl *in_stack_000001d8;
  TPZGeoBlend<pzgeom::TPZGeoPrism> *in_stack_000001e0;
  TPZGeoElSideIndex *in_stack_ffffffffffffff50;
  TPZGeoMesh *in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff64;
  void **in_stack_ffffffffffffff68;
  TPZGeoEl *in_stack_ffffffffffffff70;
  TPZRegisterClassId *local_78;
  TPZGeoElSideIndex local_58;
  int local_40;
  undefined8 local_30;
  undefined8 local_28;
  undefined4 in_stack_ffffffffffffffe8;
  
  local_28 = 0;
  local_30 = 0x21;
  TPZRegisterClassId::TPZRegisterClassId<TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoPrism>>>
            (in_RDI,0x21);
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,&PTR_PTR_02452a90);
  TPZGeoEl::TPZGeoEl(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
                     in_stack_ffffffffffffff58);
  *(undefined ***)in_RDI = &PTR__TPZGeoElRefLess_02452778;
  *(undefined ***)in_RDI = &PTR__TPZGeoElRefLess_02452778;
  pzgeom::TPZGeoBlend<pzgeom::TPZGeoPrism>::TPZGeoBlend
            (in_RSI,(TPZGeoBlend<pzgeom::TPZGeoPrism> *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  local_78 = in_RDI + 0x1c00;
  do {
    TPZGeoElSideIndex::TPZGeoElSideIndex(in_stack_ffffffffffffff50);
    local_78 = local_78 + 0x18;
  } while (local_78 != in_RDI + 0x1df8);
  for (local_40 = 0; local_40 < 0x15; local_40 = local_40 + 1) {
    TPZGeoElSideIndex::TPZGeoElSideIndex(in_stack_ffffffffffffff50);
    TPZGeoElSideIndex::operator=
              ((TPZGeoElSideIndex *)(in_RDI + (long)local_40 * 0x18 + 0x1c00),&local_58);
    TPZGeoElSideIndex::~TPZGeoElSideIndex((TPZGeoElSideIndex *)0x16d06c8);
  }
  pzgeom::TPZGeoBlend<pzgeom::TPZGeoPrism>::Initialize(in_stack_000001e0,in_stack_000001d8);
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess(TGeo &geo,int matind,TPZGeoMesh &mesh) :
TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId), TPZGeoEl(matind,mesh), fGeo(geo) {
	int i;
	for(i=0;i<TGeo::NSides;i++)fNeighbours[i] = TPZGeoElSideIndex();
    fGeo.Initialize(this);
}